

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O2

int ffpbyt(fitsfile *fptr,LONGLONG nbytes,void *buffer,int *status)

{
  LONGLONG *pLVar1;
  FITSfile *pFVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  size_t __n;
  long lVar8;
  long local_40;
  
  if (0 < *status) {
    return *status;
  }
  pFVar2 = fptr->Fptr;
  if (fptr->HDUposition != pFVar2->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    pFVar2 = fptr->Fptr;
  }
  if (pFVar2->curbuf < 0) {
    ffldrc(fptr,pFVar2->bytepos / 0xb40,0,status);
  }
  pFVar2 = fptr->Fptr;
  if (nbytes < 0x21c0) {
    lVar8 = pFVar2->bufrecnum[pFVar2->curbuf] * -0xb40 + pFVar2->bytepos;
    sVar7 = 0xb40 - lVar8;
    while (nbytes != 0) {
      __n = sVar7;
      if (nbytes < (long)sVar7) {
        __n = nbytes;
      }
      memcpy(fptr->Fptr->iobuffer + lVar8 + (long)fptr->Fptr->curbuf * 0xb40,buffer,__n);
      pFVar2 = fptr->Fptr;
      lVar3 = pFVar2->bytepos + __n;
      pFVar2->bytepos = lVar3;
      pFVar2->dirty[pFVar2->curbuf] = 1;
      buffer = (void *)((long)buffer + __n);
      nbytes = nbytes - __n;
      if (nbytes != 0) {
        sVar7 = 0xb40;
        ffldrc(fptr,lVar3 / 0xb40,1,status);
        lVar8 = 0;
      }
    }
  }
  else {
    iVar5 = pFVar2->curbuf;
    lVar6 = (long)iVar5;
    local_40 = pFVar2->bytepos;
    lVar8 = pFVar2->bufrecnum[lVar6];
    lVar3 = (nbytes + local_40 + -1) / 0xb40;
    lVar4 = lVar8 * -0xb40 + local_40;
    if (lVar4 != 0xb40) {
      sVar7 = 0xb40 - lVar4;
      memcpy(pFVar2->iobuffer + lVar4 + iVar5 * 0xb40,buffer,sVar7);
      nbytes = nbytes - sVar7;
      buffer = (void *)((long)buffer + sVar7);
      local_40 = local_40 + sVar7;
      pFVar2 = fptr->Fptr;
      pFVar2->dirty[lVar6] = 1;
    }
    for (lVar4 = -0x28; lVar4 != 0; lVar4 = lVar4 + 1) {
      if ((lVar8 <= *(long *)(pFVar2->dirty + lVar4 * 2)) &&
         (*(long *)(pFVar2->dirty + lVar4 * 2) <= lVar3)) {
        if (pFVar2->ageindex[lVar4] != 0) {
          ffbfwt(pFVar2,(int)lVar4 + 0x28,status);
          pFVar2 = fptr->Fptr;
        }
        (pFVar2->dirty + lVar4 * 2)[0] = -1;
        (pFVar2->dirty + lVar4 * 2)[1] = -1;
      }
    }
    if (pFVar2->io_pos != local_40) {
      ffseek(pFVar2,local_40);
      pFVar2 = fptr->Fptr;
    }
    lVar8 = (nbytes - (nbytes + -1) % 0xb40) + -1;
    ffwrite(pFVar2,lVar8,buffer,status);
    lVar4 = lVar8 + local_40;
    pFVar2 = fptr->Fptr;
    pFVar2->io_pos = lVar4;
    if (lVar4 < pFVar2->filesize) {
      lVar4 = (long)(iVar5 * 0xb40);
      ffread(pFVar2,0xb40,pFVar2->iobuffer + lVar4,status);
      pLVar1 = &fptr->Fptr->io_pos;
      *pLVar1 = *pLVar1 + 0xb40;
    }
    else {
      pFVar2->filesize = lVar4;
      lVar4 = lVar6 * 0xb40;
      if (pFVar2->hdutype == 1) {
        iVar5 = 0x20;
      }
      else {
        iVar5 = 0;
      }
      memset(pFVar2->iobuffer + lVar4,iVar5,0xb40);
    }
    memcpy(fptr->Fptr->iobuffer + lVar4,(void *)((long)buffer + lVar8),nbytes - lVar8);
    pFVar2 = fptr->Fptr;
    pFVar2->dirty[lVar6] = 1;
    pFVar2->bufrecnum[lVar6] = lVar3;
    lVar8 = lVar3 * 0xb40 + 0xb40;
    if (lVar8 < pFVar2->logfilesize) {
      lVar8 = pFVar2->logfilesize;
    }
    pFVar2->logfilesize = lVar8;
    pFVar2->bytepos = nbytes + local_40;
  }
  return *status;
}

Assistant:

int ffpbyt(fitsfile *fptr,   /* I - FITS file pointer                    */
           LONGLONG nbytes,      /* I - number of bytes to write             */
           void *buffer,     /* I - buffer containing the bytes to write */
           int *status)      /* IO - error status                        */
/*
  put (write) the buffer of bytes to the output FITS file, starting at
  the current file position.  Write large blocks of data directly to disk;
  write smaller segments to intermediate IO buffers to improve efficiency.
*/
{
    int ii, nbuff;
    LONGLONG filepos;
    long recstart, recend;
    long ntodo, bufpos, nspace, nwrite;
    char *cptr;

    if (*status > 0)
       return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (nbytes > LONG_MAX) {
        ffpmsg("Number of bytes to write is greater than LONG_MAX (ffpbyt).");
        *status = WRITE_ERROR;
	return(*status);
    }
    
    ntodo =  (long) nbytes;
    cptr = (char *)buffer;

    if ((fptr->Fptr)->curbuf < 0)  /* no current data buffer for this file */
    {                              /* so reload the last one that was used */
      ffldrc(fptr, (long) (((fptr->Fptr)->bytepos) / IOBUFLEN), REPORT_EOF, status);
    }

    if (nbytes >= MINDIRECT)
    {
      /* write large blocks of data directly to disk instead of via buffers */
      /* first, fill up the current IO buffer before flushing it to disk */

      nbuff = (fptr->Fptr)->curbuf;      /* current IO buffer number */
      filepos = (fptr->Fptr)->bytepos;   /* save the write starting position */
      recstart = (fptr->Fptr)->bufrecnum[nbuff];                 /* starting record */
      recend = (long) ((filepos + nbytes - 1) / IOBUFLEN);  /* ending record   */

      /* bufpos is the starting position within the IO buffer */
      bufpos = (long) (filepos - ((LONGLONG)recstart * IOBUFLEN));
      nspace = IOBUFLEN - bufpos;   /* amount of space left in the buffer */

      if (nspace)
      { /* fill up the IO buffer */
        memcpy((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN) + bufpos, cptr, nspace);
        ntodo -= nspace;           /* decrement remaining number of bytes */
        cptr += nspace;            /* increment user buffer pointer */
        filepos += nspace;         /* increment file position pointer */
        (fptr->Fptr)->dirty[nbuff] = TRUE;       /* mark record as having been modified */
      }

      for (ii = 0; ii < NIOBUF; ii++) /* flush any affected buffers to disk */
      {
        if ((fptr->Fptr)->bufrecnum[ii] >= recstart
            && (fptr->Fptr)->bufrecnum[ii] <= recend )
        {
          if ((fptr->Fptr)->dirty[ii])        /* flush modified buffer to disk */
             ffbfwt(fptr->Fptr, ii, status);

          (fptr->Fptr)->bufrecnum[ii] = -1;  /* disassociate buffer from the file */
        }
      }

      /* move to the correct write position */
      if ((fptr->Fptr)->io_pos != filepos)
         ffseek(fptr->Fptr, filepos);

      nwrite = ((ntodo - 1) / IOBUFLEN) * IOBUFLEN; /* don't write last buff */

      ffwrite(fptr->Fptr, nwrite, cptr, status); /* write the data */
      ntodo -= nwrite;                /* decrement remaining number of bytes */
      cptr += nwrite;                  /* increment user buffer pointer */
      (fptr->Fptr)->io_pos = filepos + nwrite; /* update the file position */

      if ((fptr->Fptr)->io_pos >= (fptr->Fptr)->filesize) /* at the EOF? */
      {
        (fptr->Fptr)->filesize = (fptr->Fptr)->io_pos; /* increment file size */

        /* initialize the current buffer with the correct fill value */
        if ((fptr->Fptr)->hdutype == ASCII_TBL)
          memset((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN), 32, IOBUFLEN);  /* blank fill */
        else
          memset((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN),  0, IOBUFLEN);  /* zero fill */
      }
      else
      {
        /* read next record */
        ffread(fptr->Fptr, IOBUFLEN, (fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN), status);
        (fptr->Fptr)->io_pos += IOBUFLEN; 
      }

      /* copy remaining bytes from user buffer into current IO buffer */
      memcpy((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN), cptr, ntodo);
      (fptr->Fptr)->dirty[nbuff] = TRUE;       /* mark record as having been modified */
      (fptr->Fptr)->bufrecnum[nbuff] = recend; /* record number */

      (fptr->Fptr)->logfilesize = maxvalue((fptr->Fptr)->logfilesize, 
                                       (LONGLONG)(recend + 1) * IOBUFLEN);
      (fptr->Fptr)->bytepos = filepos + nwrite + ntodo;
    }
    else
    {
      /* bufpos is the starting position in IO buffer */
      bufpos = (long) ((fptr->Fptr)->bytepos - ((LONGLONG)(fptr->Fptr)->bufrecnum[(fptr->Fptr)->curbuf] *
               IOBUFLEN));
      nspace = IOBUFLEN - bufpos;   /* amount of space left in the buffer */

      while (ntodo)
      {
        nwrite = minvalue(ntodo, nspace);

        /* copy bytes from user's buffer to the IO buffer */
        memcpy((fptr->Fptr)->iobuffer + ((fptr->Fptr)->curbuf * IOBUFLEN) + bufpos, cptr, nwrite);
        ntodo -= nwrite;            /* decrement remaining number of bytes */
        cptr += nwrite;
        (fptr->Fptr)->bytepos += nwrite;  /* increment file position pointer */
        (fptr->Fptr)->dirty[(fptr->Fptr)->curbuf] = TRUE; /* mark record as modified */

        if (ntodo)                  /* load next record into a buffer */
        {
          ffldrc(fptr, (long) ((fptr->Fptr)->bytepos / IOBUFLEN), IGNORE_EOF, status);
          bufpos = 0;
          nspace = IOBUFLEN;
        }
      }
    }
    return(*status);
}